

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

Vec_Int_t * Gla_ManRefinement(Gla_Man_t *p)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  int *piVar3;
  uint uVar4;
  Vec_Int_t *__ptr;
  ulong uVar5;
  Abc_Cex_t *pAVar6;
  long lVar7;
  Vec_Int_t *vMap;
  Abc_Cex_t *pCex;
  Vec_Int_t *local_30;
  Abc_Cex_t *local_28;
  
  Gia_GlaPrepareCexAndMap(p,&local_28,&local_30);
  __ptr = Rnm_ManRefine(p->pRnm,local_28,local_30,p->pPars->fPropFanout,p->pPars->fNewRefine,1);
  Abc_CexFree(local_28);
  if (__ptr->nSize == 0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    Abc_CexFreeP(&p->pGia->pCexSeq);
    pAVar6 = Gla_ManDeriveCex(p,local_30);
    p->pGia->pCexSeq = pAVar6;
    if (local_30->pArray != (int *)0x0) {
      free(local_30->pArray);
    }
    free(local_30);
    __ptr = (Vec_Int_t *)0x0;
  }
  else {
    if (local_30->pArray != (int *)0x0) {
      free(local_30->pArray);
    }
    free(local_30);
    uVar4 = __ptr->nSize;
    uVar5 = (ulong)uVar4;
    if (0 < (int)uVar4) {
      pGVar2 = p->pGia;
      piVar3 = __ptr->pArray;
      lVar7 = 0;
      do {
        uVar4 = (uint)uVar5;
        iVar1 = piVar3[lVar7];
        if (((long)iVar1 < 0) || (pGVar2->nObjs <= iVar1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pGVar2->pObjs == (Gia_Obj_t *)0x0) break;
        piVar3[lVar7] = p->pObj2Obj[iVar1];
        lVar7 = lVar7 + 1;
        uVar4 = __ptr->nSize;
        uVar5 = (ulong)(int)uVar4;
      } while (lVar7 < (long)uVar5);
    }
    p->nObjAdded = p->nObjAdded + uVar4;
  }
  return __ptr;
}

Assistant:

Vec_Int_t * Gla_ManRefinement( Gla_Man_t * p )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vMap, * vVec;
    Gia_Obj_t * pObj;
    int i;
    Gia_GlaPrepareCexAndMap( p, &pCex, &vMap );
    vVec = Rnm_ManRefine( p->pRnm, pCex, vMap, p->pPars->fPropFanout, p->pPars->fNewRefine, 1 );
    Abc_CexFree( pCex );
    if ( Vec_IntSize(vVec) == 0 )
    {
        Vec_IntFree( vVec );
        Abc_CexFreeP( &p->pGia->pCexSeq );
        p->pGia->pCexSeq = Gla_ManDeriveCex( p, vMap );
        Vec_IntFree( vMap );
        return NULL;
    }
    Vec_IntFree( vMap );
    // remap them into GLA objects
    Gia_ManForEachObjVec( vVec, p->pGia, pObj, i )
        Vec_IntWriteEntry( vVec, i, p->pObj2Obj[Gia_ObjId(p->pGia, pObj)] );
    p->nObjAdded += Vec_IntSize(vVec);
    return vVec;
}